

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

bool __thiscall
Inferences::ChoiceDefinitionISE::is_of_form_xy(ChoiceDefinitionISE *this,Literal *lit,TermList *x)

{
  bool bVar1;
  TermList *pTVar2;
  size_t sVar3;
  Term *in_RSI;
  TermStack args;
  TermList term;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  TermList *in_stack_ffffffffffffff78;
  TermList in_stack_ffffffffffffff80;
  bool local_72;
  TermList *local_68;
  Stack<Kernel::TermList> local_48;
  uint64_t local_28;
  uint64_t local_20;
  Term *local_10;
  
  local_10 = in_RSI;
  pTVar2 = Kernel::Term::nthArgument(in_RSI,0);
  local_28 = pTVar2->_content;
  bVar1 = ApplicativeHelper::isBool(in_stack_ffffffffffffff80);
  if (bVar1) {
    local_68 = Kernel::Term::nthArgument(local_10,1);
  }
  else {
    local_68 = Kernel::Term::nthArgument(local_10,0);
  }
  local_20 = local_68->_content;
  Lib::Stack<Kernel::TermList>::Stack
            ((Stack<Kernel::TermList> *)in_stack_ffffffffffffff80._content,
             (size_t)in_stack_ffffffffffffff78);
  ApplicativeHelper::getHeadAndArgs
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (TermStack *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  bVar1 = Kernel::TermList::isVar
                    ((TermList *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  local_72 = false;
  if (bVar1) {
    sVar3 = Lib::Stack<Kernel::TermList>::size(&local_48);
    local_72 = false;
    if (sVar3 == 1) {
      Lib::Stack<Kernel::TermList>::operator[](&local_48,0);
      in_stack_ffffffffffffff77 =
           Kernel::TermList::isVar
                     ((TermList *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
      local_72 = (bool)in_stack_ffffffffffffff77;
    }
  }
  Lib::Stack<Kernel::TermList>::~Stack
            ((Stack<Kernel::TermList> *)
             CONCAT17(in_stack_ffffffffffffff77,CONCAT16(local_72,in_stack_ffffffffffffff70)));
  return (bool)(local_72 & 1);
}

Assistant:

bool ChoiceDefinitionISE::is_of_form_xy(Literal* lit, TermList& x){
  TermList term = AH::isBool(*lit->nthArgument(0)) ? *lit->nthArgument(1) : *lit->nthArgument(0);
  
  TermStack args;
  ApplicativeHelper::getHeadAndArgs(term, x, args);
  return (x.isVar() && args.size() == 1 && args[0].isVar());
}